

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall Loop::IsSymAssignedToInSelfOrParents(Loop *this,StackSym *sym)

{
  bool bVar1;
  
  bVar1 = IsSymAssignedToInSelfOrParents(this,(sym->super_Sym).m_id);
  return bVar1;
}

Assistant:

bool
Loop::IsSymAssignedToInSelfOrParents(StackSym * const sym) const
{
    return IsSymAssignedToInSelfOrParents(sym->m_id);
}